

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_instance_cache.cpp
# Opt level: O1

shared_ptr<duckdb::DuckDB,_true> __thiscall
duckdb::DBInstanceCache::CreateInstanceInternal
          (DBInstanceCache *this,string *database,DBConfig *config,bool cache_instance,
          function<void_(duckdb::DuckDB_&)> *on_create)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  type pFVar3;
  iterator iVar4;
  long lVar5;
  DatabaseCacheEntry *pDVar6;
  mapped_type *pmVar7;
  Exception *this_00;
  long *plVar8;
  undefined7 in_register_00000009;
  DBConfig *pDVar9;
  size_type *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  long in_R9;
  DatabaseCacheEntry *__tmp;
  shared_ptr<duckdb::DuckDB,_true> sVar12;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> cache_entry;
  string instance_path;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> tmp_fs;
  string abs_database_path;
  undefined1 local_a9;
  shared_ptr<duckdb::DatabaseCacheEntry,_true> local_a8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  key_type local_58;
  DBConfig *local_38;
  
  pDVar9 = (DBConfig *)CONCAT71(in_register_00000009,cache_instance);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if ((pDVar9->file_system).
      super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
      super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl == (FileSystem *)0x0) {
    FileSystem::CreateLocal();
    pFVar3 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)&local_78);
    GetDBAbsolutePath(&local_98,(string *)config,pFVar3);
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  else {
    pFVar3 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator*(&pDVar9->file_system);
    GetDBAbsolutePath(&local_98,(string *)config,pFVar3);
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  iVar4 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)database,&local_58);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    lVar5 = ::std::__cxx11::string::rfind((char *)&local_58,0x12d8aae,0);
    if (lVar5 == 0) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_98,0,(char *)local_98._M_string_length,0x12d8aae);
    }
    local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)on_create != '\0') {
      local_78._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::DatabaseCacheEntry,std::allocator<duckdb::DatabaseCacheEntry>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
                 (DatabaseCacheEntry **)&local_78,(allocator<duckdb::DatabaseCacheEntry> *)&local_38
                );
      sVar2 = local_78._M_string_length;
      _Var1._M_p = local_78._M_dataplus._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_78._M_string_length + 8) =
               *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
      _Var11._M_pi = local_a8.internal.
                     super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var1._M_p;
      local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar2;
      if (_Var11._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var11._M_pi);
      }
      shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator=(&pDVar9->db_cache_entry,&local_a8);
    }
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_38 = pDVar9;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::DuckDB,std::allocator<duckdb::DuckDB>,std::__cxx11::string&,duckdb::DBConfig*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
               (DuckDB **)&local_78,(allocator<duckdb::DuckDB> *)&local_a9,&local_98,&local_38);
    (this->db_instances)._M_h._M_buckets = (__buckets_ptr)local_78._M_dataplus._M_p;
    (this->db_instances)._M_h._M_bucket_count = local_78._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_78._M_string_length + 8) =
             *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_78._M_string_length + 8) =
             *(_Atomic_word *)(local_78._M_string_length + 8) + 1;
      }
    }
    _Var11._M_pi = extraout_RDX;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      _Var11._M_pi = extraout_RDX_00;
    }
    if (local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      pDVar6 = shared_ptr<duckdb::DatabaseCacheEntry,_true>::operator->(&local_a8);
      (pDVar6->database).internal.super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(this->db_instances)._M_h._M_buckets;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pDVar6->database).internal.
                  super___weak_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->db_instances)._M_h._M_bucket_count);
      pmVar7 = ::std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::weak_ptr<duckdb::DatabaseCacheEntry,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)database,&local_58);
      (pmVar7->internal).super___weak_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = local_a8.internal.
               super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar7->internal).
                  super___weak_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &local_a8.internal.
                  super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var11._M_pi = extraout_RDX_01;
    }
    if (*(long *)(in_R9 + 0x10) != 0) {
      shared_ptr<duckdb::DuckDB,_true>::operator*((shared_ptr<duckdb::DuckDB,_true> *)this);
      if (*(long *)(in_R9 + 0x10) == 0) {
        ::std::__throw_bad_function_call();
      }
      (**(code **)(in_R9 + 0x18))();
      _Var11._M_pi = extraout_RDX_02;
    }
    if (local_a8.internal.super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.internal.
                 super___shared_ptr<duckdb::DatabaseCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var11._M_pi = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
      _Var11._M_pi = extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      _Var11._M_pi = extraout_RDX_05;
    }
    sVar12.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var11._M_pi;
    sVar12.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::DuckDB,_true>)
           sVar12.internal.super___shared_ptr<duckdb::DuckDB,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_78,"Instance with path: ",&local_58);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_78);
  local_98._M_dataplus._M_p = (pointer)*plVar8;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_98._M_dataplus._M_p == psVar10) {
    local_98.field_2._M_allocated_capacity = *psVar10;
    local_98.field_2._8_8_ = plVar8[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar10;
  }
  local_98._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  Exception::Exception(this_00,CONNECTION,&local_98);
  __cxa_throw(this_00,&Exception::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<DuckDB> DBInstanceCache::CreateInstanceInternal(const string &database, DBConfig &config,
                                                           bool cache_instance,
                                                           const std::function<void(DuckDB &)> &on_create) {
	string abs_database_path;
	if (config.file_system) {
		abs_database_path = GetDBAbsolutePath(database, *config.file_system);
	} else {
		auto tmp_fs = FileSystem::CreateLocal();
		abs_database_path = GetDBAbsolutePath(database, *tmp_fs);
	}
	if (db_instances.find(abs_database_path) != db_instances.end()) {
		throw duckdb::Exception(ExceptionType::CONNECTION,
		                        "Instance with path: " + abs_database_path + " already exists.");
	}
	// Creates new instance
	string instance_path = abs_database_path;
	if (abs_database_path.rfind(IN_MEMORY_PATH, 0) == 0) {
		instance_path = IN_MEMORY_PATH;
	}
	shared_ptr<DatabaseCacheEntry> cache_entry;
	if (cache_instance) {
		cache_entry = make_shared_ptr<DatabaseCacheEntry>();
		config.db_cache_entry = cache_entry;
	}
	auto db_instance = make_shared_ptr<DuckDB>(instance_path, &config);
	if (cache_entry) {
		// attach cache entry to the database
		cache_entry->database = db_instance;

		// cache the entry in the db_instances map
		db_instances[abs_database_path] = cache_entry;
	}
	if (on_create) {
		on_create(*db_instance);
	}
	return db_instance;
}